

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O2

void __thiscall serial::Serial::SerialImpl::reconfigurePort(SerialImpl *this)

{
  stopbits_t sVar1;
  flowcontrol_t fVar2;
  unsigned_long uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  IOException *pIVar7;
  int *piVar8;
  invalid_argument *this_00;
  ulong uVar9;
  bool bVar10;
  speed_t __speed;
  undefined1 auVar11 [16];
  allocator<char> local_129;
  termios local_128;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  allocator<char> local_60 [16];
  uint local_50;
  int local_48;
  int local_44;
  
  if (this->fd_ == -1) {
    pIVar7 = (IOException *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/eyesight-tech[P]serial/src/impl/unix.cc"
               ,local_60);
    IOException::IOException
              (pIVar7,&local_80,0xb0,"Invalid file descriptor, is the serial port open?");
    __cxa_throw(pIVar7,&IOException::typeinfo,IOException::~IOException);
  }
  iVar4 = tcgetattr(this->fd_,&local_128);
  if (iVar4 == -1) {
    pIVar7 = (IOException *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/eyesight-tech[P]serial/src/impl/unix.cc"
               ,local_60);
    IOException::IOException(pIVar7,&local_a0,0xb6,"::tcgetattr");
    __cxa_throw(pIVar7,&IOException::typeinfo,IOException::~IOException);
  }
  local_128.c_iflag = local_128.c_iflag & 0xfffffc36;
  local_128.c_oflag = local_128.c_oflag & 0xfffffffe;
  local_128.c_lflag = local_128.c_lflag & 0xffff7f84;
  local_128.c_cflag = local_128.c_cflag | DAT_0010d280._8_4_;
  uVar3 = this->baudrate_;
  if (uVar3 == 0) {
    __speed = 0;
LAB_001095ce:
    cfsetispeed(&local_128,__speed);
    cfsetospeed(&local_128,__speed);
  }
  else {
    if (uVar3 == 4000000) {
      __speed = 0x100f;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x4b) {
      __speed = 2;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x6e) {
      __speed = 3;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x86) {
      __speed = 4;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x96) {
      __speed = 5;
      goto LAB_001095ce;
    }
    if (uVar3 == 200) {
      __speed = 6;
      goto LAB_001095ce;
    }
    if (uVar3 == 300) {
      __speed = 7;
      goto LAB_001095ce;
    }
    if (uVar3 == 600) {
      __speed = 8;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x4b0) {
      __speed = 9;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x708) {
      __speed = 10;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x960) {
      __speed = 0xb;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x12c0) {
      __speed = 0xc;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x2580) {
      __speed = 0xd;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x4b00) {
      __speed = 0xe;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x9600) {
      __speed = 0xf;
      goto LAB_001095ce;
    }
    if (uVar3 == 0xe100) {
      __speed = 0x1001;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x1c200) {
      __speed = 0x1002;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x38400) {
      __speed = 0x1003;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x70800) {
      __speed = 0x1004;
      goto LAB_001095ce;
    }
    if (uVar3 == 500000) {
      __speed = 0x1005;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x8ca00) {
      __speed = 0x1006;
      goto LAB_001095ce;
    }
    if (uVar3 == 0xe1000) {
      __speed = 0x1007;
      goto LAB_001095ce;
    }
    if (uVar3 == 1000000) {
      __speed = 0x1008;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x119400) {
      __speed = 0x1009;
      goto LAB_001095ce;
    }
    if (uVar3 == 1500000) {
      __speed = 0x100a;
      goto LAB_001095ce;
    }
    if (uVar3 == 2000000) {
      __speed = 0x100b;
      goto LAB_001095ce;
    }
    if (uVar3 == 2500000) {
      __speed = 0x100c;
      goto LAB_001095ce;
    }
    if (uVar3 == 3000000) {
      __speed = 0x100d;
      goto LAB_001095ce;
    }
    if (uVar3 == 3500000) {
      __speed = 0x100e;
      goto LAB_001095ce;
    }
    if (uVar3 == 0x32) {
      __speed = 1;
      goto LAB_001095ce;
    }
    iVar4 = ioctl(this->fd_,0x541e,local_60);
    if (iVar4 == -1) {
      pIVar7 = (IOException *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/eyesight-tech[P]serial/src/impl/unix.cc"
                 ,&local_129);
      piVar8 = __errno_location();
      IOException::IOException(pIVar7,&local_c0,0x14e,*piVar8);
      __cxa_throw(pIVar7,&IOException::typeinfo,IOException::~IOException);
    }
    local_48 = local_44 / (int)this->baudrate_;
    local_50 = local_50 & 0xffffefcf | 0x30;
    iVar4 = ioctl(this->fd_,0x541f,local_60);
    if (iVar4 == -1) {
      pIVar7 = (IOException *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/eyesight-tech[P]serial/src/impl/unix.cc"
                 ,&local_129);
      piVar8 = __errno_location();
      IOException::IOException(pIVar7,&local_e0,0x158,*piVar8);
      __cxa_throw(pIVar7,&IOException::typeinfo,IOException::~IOException);
    }
  }
  uVar5 = local_128.c_cflag & 0xffffffcf;
  switch(this->bytesize_) {
  case fivebits:
    break;
  case sixbits:
    uVar5 = uVar5 | 0x10;
    break;
  case sevenbits:
    uVar5 = uVar5 | 0x20;
    break;
  case eightbits:
    uVar5 = local_128.c_cflag | 0x30;
    break;
  default:
    local_128.c_cflag = uVar5;
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"invalid char len");
    goto LAB_001098a0;
  }
  sVar1 = this->stopbits_;
  if ((sVar1 == stopbits_one_point_five) || (sVar1 == stopbits_two)) {
    local_128.c_cflag = uVar5 | 0x40;
  }
  else {
    if (sVar1 != stopbits_one) {
      local_128.c_cflag = uVar5;
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"invalid stop bit");
      goto LAB_001098a0;
    }
    local_128.c_cflag = uVar5 & 0xffffffbf;
  }
  uVar5 = local_128.c_iflag & 0xffffffcf;
  switch(this->parity_) {
  case parity_none:
    uVar6 = local_128.c_cflag & 0xfffffcff;
    break;
  case parity_odd:
    uVar6 = local_128.c_cflag | 0x300;
    break;
  case parity_even:
    uVar6 = local_128.c_cflag & 0xfffffcff | 0x100;
    break;
  case parity_mark:
    uVar6 = local_128.c_cflag | 0x40000300;
    break;
  case parity_space:
    uVar6 = local_128.c_cflag & 0xbffffcff | 0x40000100;
    break;
  default:
    local_128.c_iflag = uVar5;
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"invalid parity");
LAB_001098a0:
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  fVar2 = this->flowcontrol_;
  if (fVar2 == flowcontrol_none) {
    bVar10 = false;
    local_128.c_cflag = 0;
  }
  else {
    if (fVar2 != flowcontrol_hardware) {
      if (fVar2 == flowcontrol_software) {
        this->xonxoff_ = true;
        this->rtscts_ = false;
        local_128.c_cflag = 0;
        local_128.c_iflag = uVar5 | 0x1400;
      }
      else {
        local_128.c_cflag = (uint)this->rtscts_ << 0x1f;
        local_128.c_iflag = local_128.c_iflag & 0xffffe3cf;
        if ((this->xonxoff_ & 1U) != 0) {
          local_128.c_iflag = uVar5 | 0x1400;
        }
      }
      goto LAB_001096f4;
    }
    local_128.c_cflag = 0x80000000;
    bVar10 = true;
  }
  this->xonxoff_ = false;
  this->rtscts_ = bVar10;
  local_128.c_iflag = local_128.c_iflag & 0xffffe3cf;
LAB_001096f4:
  local_128.c_cflag = uVar6 & 0x7fffffff | local_128.c_cflag;
  local_128.c_cc[5] = '\0';
  local_128.c_cc[6] = '\0';
  tcsetattr(this->fd_,0,&local_128);
  auVar11._0_8_ = (double)CONCAT44(0x43300000,(int)this->baudrate_);
  auVar11._8_4_ = (int)(this->baudrate_ >> 0x20);
  auVar11._12_4_ = 0x45300000;
  uVar9 = (ulong)(1000000000.0 /
                 ((auVar11._8_8_ - 1.9342813113834067e+25) + (auVar11._0_8_ - 4503599627370496.0)));
  uVar5 = (this->bytesize_ + this->parity_ + this->stopbits_ + 1) * (int)uVar9;
  if (this->stopbits_ == stopbits_one_point_five) {
    uVar5 = (uint)(long)((double)(uVar9 & 0xffffffff) * -1.5 + (double)uVar5);
  }
  this->byte_time_ns_ = uVar5;
  return;
}

Assistant:

void
Serial::SerialImpl::reconfigurePort ()
{
  if (fd_ == -1) {
    // Can only operate on a valid file descriptor
    THROW (IOException, "Invalid file descriptor, is the serial port open?");
  }

  struct termios options; // The options for the file descriptor

  if (tcgetattr(fd_, &options) == -1) {
    THROW (IOException, "::tcgetattr");
  }

  // set up raw mode / no echo / binary
  options.c_cflag |= (tcflag_t)  (CLOCAL | CREAD);
  options.c_lflag &= (tcflag_t) ~(ICANON | ECHO | ECHOE | ECHOK | ECHONL |
                                       ISIG | IEXTEN); //|ECHOPRT

  options.c_oflag &= (tcflag_t) ~(OPOST);
  options.c_iflag &= (tcflag_t) ~(INLCR | IGNCR | ICRNL | IGNBRK);
#ifdef IUCLC
  options.c_iflag &= (tcflag_t) ~IUCLC;
#endif
#ifdef PARMRK
  options.c_iflag &= (tcflag_t) ~PARMRK;
#endif

  // setup baud rate
  bool custom_baud = false;
  speed_t baud;
  switch (baudrate_) {
#ifdef B0
  case 0: baud = B0; break;
#endif
#ifdef B50
  case 50: baud = B50; break;
#endif
#ifdef B75
  case 75: baud = B75; break;
#endif
#ifdef B110
  case 110: baud = B110; break;
#endif
#ifdef B134
  case 134: baud = B134; break;
#endif
#ifdef B150
  case 150: baud = B150; break;
#endif
#ifdef B200
  case 200: baud = B200; break;
#endif
#ifdef B300
  case 300: baud = B300; break;
#endif
#ifdef B600
  case 600: baud = B600; break;
#endif
#ifdef B1200
  case 1200: baud = B1200; break;
#endif
#ifdef B1800
  case 1800: baud = B1800; break;
#endif
#ifdef B2400
  case 2400: baud = B2400; break;
#endif
#ifdef B4800
  case 4800: baud = B4800; break;
#endif
#ifdef B7200
  case 7200: baud = B7200; break;
#endif
#ifdef B9600
  case 9600: baud = B9600; break;
#endif
#ifdef B14400
  case 14400: baud = B14400; break;
#endif
#ifdef B19200
  case 19200: baud = B19200; break;
#endif
#ifdef B28800
  case 28800: baud = B28800; break;
#endif
#ifdef B57600
  case 57600: baud = B57600; break;
#endif
#ifdef B76800
  case 76800: baud = B76800; break;
#endif
#ifdef B38400
  case 38400: baud = B38400; break;
#endif
#ifdef B115200
  case 115200: baud = B115200; break;
#endif
#ifdef B128000
  case 128000: baud = B128000; break;
#endif
#ifdef B153600
  case 153600: baud = B153600; break;
#endif
#ifdef B230400
  case 230400: baud = B230400; break;
#endif
#ifdef B256000
  case 256000: baud = B256000; break;
#endif
#ifdef B460800
  case 460800: baud = B460800; break;
#endif
#ifdef B500000
  case 500000: baud = B500000; break;
#endif
#ifdef B576000
  case 576000: baud = B576000; break;
#endif
#ifdef B921600
  case 921600: baud = B921600; break;
#endif
#ifdef B1000000
  case 1000000: baud = B1000000; break;
#endif
#ifdef B1152000
  case 1152000: baud = B1152000; break;
#endif
#ifdef B1500000
  case 1500000: baud = B1500000; break;
#endif
#ifdef B2000000
  case 2000000: baud = B2000000; break;
#endif
#ifdef B2500000
  case 2500000: baud = B2500000; break;
#endif
#ifdef B3000000
  case 3000000: baud = B3000000; break;
#endif
#ifdef B3500000
  case 3500000: baud = B3500000; break;
#endif
#ifdef B4000000
  case 4000000: baud = B4000000; break;
#endif
  default:
    custom_baud = true;
    // OS X support
#if defined(MAC_OS_X_VERSION_10_4) && (MAC_OS_X_VERSION_MIN_REQUIRED >= MAC_OS_X_VERSION_10_4)
    // Starting with Tiger, the IOSSIOSPEED ioctl can be used to set arbitrary baud rates
    // other than those specified by POSIX. The driver for the underlying serial hardware
    // ultimately determines which baud rates can be used. This ioctl sets both the input
    // and output speed.
    speed_t new_baud = static_cast<speed_t> (baudrate_);
    if (-1 == ioctl (fd_, IOSSIOSPEED, &new_baud, 1)) {
      THROW (IOException, errno);
    }
    // Linux Support
#elif defined(__linux__) && defined (TIOCSSERIAL)
    struct serial_struct ser;

    if (-1 == ioctl (fd_, TIOCGSERIAL, &ser)) {
      THROW (IOException, errno);
    }

    // set custom divisor
    ser.custom_divisor = ser.baud_base / static_cast<int> (baudrate_);
    // update flags
    ser.flags &= ~ASYNC_SPD_MASK;
    ser.flags |= ASYNC_SPD_CUST;

    if (-1 == ioctl (fd_, TIOCSSERIAL, &ser)) {
      THROW (IOException, errno);
    }
#else
    throw invalid_argument ("OS does not currently support custom bauds");
#endif
  }
  if (custom_baud == false) {
#ifdef _BSD_SOURCE
    ::cfsetspeed(&options, baud);
#else
    ::cfsetispeed(&options, baud);
    ::cfsetospeed(&options, baud);
#endif
  }

  // setup char len
  options.c_cflag &= (tcflag_t) ~CSIZE;
  if (bytesize_ == eightbits)
    options.c_cflag |= CS8;
  else if (bytesize_ == sevenbits)
    options.c_cflag |= CS7;
  else if (bytesize_ == sixbits)
    options.c_cflag |= CS6;
  else if (bytesize_ == fivebits)
    options.c_cflag |= CS5;
  else
    throw invalid_argument ("invalid char len");
  // setup stopbits
  if (stopbits_ == stopbits_one)
    options.c_cflag &= (tcflag_t) ~(CSTOPB);
  else if (stopbits_ == stopbits_one_point_five)
    // ONE POINT FIVE same as TWO.. there is no POSIX support for 1.5
    options.c_cflag |=  (CSTOPB);
  else if (stopbits_ == stopbits_two)
    options.c_cflag |=  (CSTOPB);
  else
    throw invalid_argument ("invalid stop bit");
  // setup parity
  options.c_iflag &= (tcflag_t) ~(INPCK | ISTRIP);
  if (parity_ == parity_none) {
    options.c_cflag &= (tcflag_t) ~(PARENB | PARODD);
  } else if (parity_ == parity_even) {
    options.c_cflag &= (tcflag_t) ~(PARODD);
    options.c_cflag |=  (PARENB);
  } else if (parity_ == parity_odd) {
    options.c_cflag |=  (PARENB | PARODD);
  }
#ifdef CMSPAR
  else if (parity_ == parity_mark) {
    options.c_cflag |=  (PARENB | CMSPAR | PARODD);
  }
  else if (parity_ == parity_space) {
    options.c_cflag |=  (PARENB | CMSPAR);
    options.c_cflag &= (tcflag_t) ~(PARODD);
  }
#else
  // CMSPAR is not defined on OSX. So do not support mark or space parity.
  else if (parity_ == parity_mark || parity_ == parity_space) {
    throw invalid_argument ("OS does not support mark or space parity");
  }
#endif  // ifdef CMSPAR
  else {
    throw invalid_argument ("invalid parity");
  }